

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

void * delpos234_internal(tree234 *t,int index)

{
  node234_conflict *pnVar1;
  node234 *pnVar2;
  node234 *pnVar3;
  bool bVar4;
  node234 *pnVar5;
  node234_conflict *pnVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  node234_conflict *sib;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  uint uVar13;
  node234_conflict *ptr;
  node234_conflict *a;
  uint uVar14;
  node234 *pnVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong local_48;
  void *local_38;
  
  local_48 = 0xffffffff;
  local_38 = (void *)0x0;
  pnVar15 = t->root;
joined_r0x00164104:
  while (iVar17 = index, ptr = pnVar15, ptr != (node234_conflict *)0x0) {
    uVar14 = ptr->counts[0];
    if (iVar17 < (int)uVar14) goto code_r0x00164112;
    index = ~uVar14 + iVar17;
    if (index < 0) {
      local_48 = 0;
      goto LAB_00164556;
    }
    lVar9 = 1;
    bVar4 = true;
    if (ptr->counts[1] <= index) {
      index = index + ~ptr->counts[1];
      if (index < 0) {
        local_48 = 1;
        goto LAB_00164556;
      }
      lVar9 = 2;
      if (ptr->counts[2] <= index) {
        index = index + ~ptr->counts[2];
        if (index < 0) {
          local_48 = 2;
          goto LAB_00164556;
        }
        bVar4 = false;
        lVar9 = 3;
      }
    }
    iVar18 = (int)lVar9;
    pnVar15 = ptr->kids[lVar9];
    if (pnVar15->elems[1] == (void *)0x0) {
      uVar7 = iVar18 - 1;
      pnVar2 = ptr->kids[uVar7];
      if (pnVar2->elems[1] == (void *)0x0) {
        if (bVar4) goto LAB_001642a3;
        goto LAB_001643d3;
      }
      pvVar8 = pnVar2->elems[2];
      pnVar15->elems[1] = pnVar15->elems[0];
      pnVar3 = pnVar15->kids[1];
      pnVar15->kids[1] = pnVar15->kids[0];
      pnVar15->kids[2] = pnVar3;
      *(undefined8 *)(pnVar15->counts + 1) = *(undefined8 *)pnVar15->counts;
      pnVar15->elems[0] = ptr->elems[uVar7];
      uVar14 = (uint)(pvVar8 == (void *)0x0);
      uVar13 = uVar14 ^ 3;
      pnVar3 = pnVar2->kids[uVar13];
      pnVar15->kids[0] = pnVar3;
      pnVar15->counts[0] = pnVar2->counts[uVar13];
      if (pnVar3 != (node234 *)0x0) {
        pnVar3->parent = pnVar15;
      }
      uVar14 = 2 - uVar14;
      ptr->elems[uVar7] = pnVar2->elems[uVar14];
      pnVar2->kids[uVar13] = (node234 *)0x0;
      pnVar2->counts[uVar13] = 0;
      pnVar2->elems[uVar14] = (void *)0x0;
      iVar17 = pnVar15->counts[3] + pnVar15->counts[1] + pnVar15->counts[2] + pnVar15->counts[0];
      lVar11 = 7;
      do {
        iVar17 = (iVar17 + 1) - (uint)(pnVar15->kids[lVar11 + -1] == (node234 *)0x0);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 10);
      ptr->counts[lVar9] = iVar17;
      iVar17 = ptr->counts[uVar7];
      if (pnVar2 == (node234 *)0x0) {
        iVar18 = 0;
      }
      else {
        iVar18 = pnVar2->counts[3] + pnVar2->counts[1] + pnVar2->counts[2] + pnVar2->counts[0];
        lVar9 = 0;
        do {
          iVar18 = (iVar18 + 1) - (uint)(pnVar2->elems[lVar9] == (void *)0x0);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      ptr->counts[uVar7] = iVar18;
      index = (index + iVar17) - iVar18;
    }
  }
  ptr = (node234_conflict *)0x0;
LAB_00164556:
  iVar17 = (int)local_48;
  if (local_38 == (void *)0x0) {
    local_38 = ptr->elems[iVar17];
  }
  if (iVar17 == -1) {
    return (void *)0x0;
  }
  pnVar1 = ptr->parent;
  if (((pnVar1 == (node234_conflict *)0x0) && (ptr->elems[1] == (void *)0x0)) &&
     (ptr->kids[0] == (node234 *)0x0)) {
    safefree(ptr);
    t->root = (node234_conflict *)0x0;
    return local_38;
  }
  if ((ptr->kids[0] != (node234 *)0x0) || (ptr->elems[1] == (void *)0x0)) {
    pnVar15 = ptr->kids[local_48];
    if (pnVar15->elems[1] == (void *)0x0) {
      pnVar2 = ptr->kids[local_48 + 1];
      pnVar3 = pnVar2;
      if (pnVar2->elems[1] == (void *)0x0) {
        pnVar15->elems[1] = ptr->elems[local_48];
        pnVar3 = pnVar2->kids[0];
        pnVar15->kids[2] = pnVar3;
        pnVar15->counts[2] = pnVar2->counts[0];
        if (pnVar3 != (node234 *)0x0) {
          pnVar3->parent = pnVar15;
        }
        pnVar15->elems[2] = pnVar2->elems[0];
        pnVar3 = pnVar2->kids[1];
        pnVar15->kids[3] = pnVar3;
        pnVar15->counts[3] = pnVar2->counts[1];
        if (pnVar3 != (node234 *)0x0) {
          pnVar3->parent = pnVar15;
        }
        uVar16 = local_48 + 1;
        safefree(pnVar2);
        iVar18 = pnVar15->counts[3] + pnVar15->counts[1] + pnVar15->counts[2] + pnVar15->counts[0];
        lVar9 = 7;
        do {
          iVar18 = (iVar18 + 1) - (uint)(pnVar15->kids[lVar9 + -1] == (node234 *)0x0);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 10);
        ptr->counts[local_48] = iVar18;
        uVar10 = local_48;
        if (iVar17 < 2) {
          lVar9 = local_48 + 8;
          do {
            iVar17 = (int)lVar9;
            if (ptr->kids[lVar9 + -1] == (node234 *)0x0) {
              uVar14 = iVar17 - 8;
              goto LAB_0016470e;
            }
            ptr->kids[lVar9 + -2] = ptr->kids[lVar9 + -1];
            ptr->kids[lVar9 + -7] = ptr->kids[lVar9 + -6];
            ptr->counts[lVar9 + -7] = ptr->counts[lVar9 + -6];
            lVar9 = lVar9 + 1;
          } while (iVar17 != 9);
          uVar14 = 2;
LAB_0016470e:
          uVar10 = (ulong)uVar14;
          uVar16 = (ulong)(uVar14 + 1);
        }
        ptr->elems[uVar10] = (void *)0x0;
        ptr->kids[uVar16] = (node234 *)0x0;
        ptr->counts[uVar16] = 0;
        if (ptr->elems[0] == (void *)0x0) {
          t->root = pnVar15;
          pnVar15->parent = (node234_conflict *)0x0;
          safefree(ptr);
        }
        index = pnVar15->counts[0] + pnVar15->counts[1] + 1;
      }
      else {
        do {
          pnVar15 = pnVar3;
          pnVar3 = pnVar15->kids[0];
        } while (pnVar3 != (node234 *)0x0);
        ptr->elems[local_48] = pnVar15->elems[0];
        pnVar15 = pnVar2;
        index = 0;
      }
    }
    else {
      pnVar2 = pnVar15->kids[0];
      pnVar3 = pnVar15;
      while (pnVar2 != (node234 *)0x0) {
        pnVar5 = pnVar3->kids[3];
        if (((pnVar3->kids[3] == (node234 *)0x0) &&
            (pnVar5 = pnVar3->kids[2], pnVar3->kids[2] == (node234 *)0x0)) &&
           (pnVar5 = pnVar2, pnVar3->kids[1] != (node234 *)0x0)) {
          pnVar5 = pnVar3->kids[1];
        }
        pnVar3 = pnVar5;
        pnVar2 = pnVar5->kids[0];
      }
      pvVar8 = pnVar3->elems[2];
      if ((pvVar8 == (void *)0x0) && (pvVar8 = pnVar3->elems[1], pvVar8 == (void *)0x0)) {
        pvVar8 = pnVar3->elems[0];
      }
      ptr->elems[local_48] = pvVar8;
      index = ptr->counts[local_48] + -1;
    }
    goto joined_r0x00164104;
  }
  if (iVar17 < 2) {
    do {
      if (ptr->elems[local_48 + 1] == (void *)0x0) goto LAB_00164790;
      ptr->elems[local_48] = ptr->elems[local_48 + 1];
      local_48 = local_48 + 1;
    } while ((int)local_48 != 2);
    local_48 = 2;
  }
LAB_00164790:
  ptr->elems[local_48 & 0xffffffff] = (void *)0x0;
  while (pnVar6 = pnVar1, pnVar6 != (node234_conflict *)0x0) {
    if (pnVar6->kids[0] == ptr) {
      uVar16 = 0;
    }
    else if (pnVar6->kids[1] == ptr) {
      uVar16 = 1;
    }
    else {
      uVar16 = (ulong)(pnVar6->kids[2] == ptr) ^ 3;
    }
    pnVar6->counts[uVar16] = pnVar6->counts[uVar16] + -1;
    ptr = pnVar6;
    pnVar1 = pnVar6->parent;
  }
  return local_38;
code_r0x00164112:
  pnVar15 = ptr->kids[0];
  index = iVar17;
  if (pnVar15->elems[1] == (void *)0x0) {
    lVar9 = 0;
LAB_001642a3:
    iVar18 = (int)lVar9;
    pnVar2 = ptr->kids[iVar18 + 1U];
    if ((pnVar2 == (node234 *)0x0) || (pnVar2->elems[1] == (void *)0x0)) {
      uVar16 = 0;
      if ((int)uVar14 <= iVar17) {
LAB_001643d3:
        index = index + ptr->counts[iVar18 - 1U] + 1;
        uVar16 = (ulong)(iVar18 - 1U);
      }
      pnVar2 = ptr->kids[uVar16];
      pnVar15 = ptr->kids[uVar16 + 1];
      pnVar15->elems[2] = pnVar15->elems[0];
      pnVar15->kids[2] = pnVar15->kids[0];
      pnVar15->kids[3] = pnVar15->kids[1];
      *(undefined8 *)(pnVar15->counts + 2) = *(undefined8 *)pnVar15->counts;
      pnVar15->elems[1] = ptr->elems[uVar16];
      pnVar3 = pnVar2->kids[1];
      pnVar15->kids[1] = pnVar3;
      pnVar15->counts[1] = pnVar2->counts[1];
      if (pnVar3 != (node234 *)0x0) {
        pnVar3->parent = pnVar15;
      }
      pnVar15->elems[0] = pnVar2->elems[0];
      pnVar3 = pnVar2->kids[0];
      pnVar15->kids[0] = pnVar3;
      pnVar15->counts[0] = pnVar2->counts[0];
      if (pnVar3 != (node234 *)0x0) {
        pnVar3->parent = pnVar15;
      }
      iVar17 = pnVar15->counts[3] + pnVar15->counts[1] + pnVar15->counts[2] + pnVar15->counts[0];
      lVar9 = 7;
      do {
        iVar17 = (iVar17 + 1) - (uint)(pnVar15->kids[lVar9 + -1] == (node234 *)0x0);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 10);
      ptr->counts[uVar16 + 1] = iVar17;
      safefree(pnVar2);
      if ((int)uVar16 < 3) {
        do {
          if (ptr->kids[uVar16 + 1] == (node234 *)0x0) {
            uVar16 = uVar16 & 0xffffffff;
            ptr->kids[uVar16] = (node234 *)0x0;
            ptr->counts[uVar16] = 0;
            ptr->elems[uVar16] = (void *)0x0;
            goto LAB_0016450d;
          }
          ptr->kids[uVar16] = ptr->kids[uVar16 + 1];
          ptr->counts[uVar16] = ptr->counts[uVar16 + 1];
          if (uVar16 == 2) {
            ptr->elems[2] = (void *)0x0;
            break;
          }
          ptr->elems[uVar16] = ptr->elems[uVar16 + 1];
          uVar16 = uVar16 + 1;
        } while (uVar16 != 3);
        uVar16 = 3;
      }
      ptr->kids[uVar16] = (node234 *)0x0;
      ptr->counts[uVar16] = 0;
LAB_0016450d:
      if (ptr->elems[0] == (void *)0x0) {
        t->root = pnVar15;
        pnVar15->parent = (node234_conflict *)0x0;
        safefree(ptr);
      }
    }
    else {
      pnVar15->elems[1] = ptr->elems[lVar9];
      pnVar3 = pnVar2->kids[0];
      pnVar15->kids[2] = pnVar3;
      pnVar15->counts[2] = pnVar2->counts[0];
      if (pnVar3 != (node234 *)0x0) {
        pnVar3->parent = pnVar15;
      }
      ptr->elems[lVar9] = pnVar2->elems[0];
      pnVar2->kids[0] = pnVar2->kids[1];
      pnVar2->counts[0] = pnVar2->counts[1];
      lVar11 = 0;
      bVar4 = true;
      do {
        bVar12 = bVar4;
        pvVar8 = pnVar2->elems[lVar11 + 1];
        if (pvVar8 == (void *)0x0) goto LAB_00164333;
        pnVar2->kids[lVar11 + 1] = pnVar2->kids[lVar11 + 2];
        pnVar2->counts[lVar11 + 1] = pnVar2->counts[lVar11 + 2];
        pnVar2->elems[lVar11] = pvVar8;
        lVar11 = 1;
        bVar4 = false;
      } while (bVar12);
      lVar11 = 2;
LAB_00164333:
      iVar17 = 0;
      pnVar2->kids[lVar11 + 1] = (node234 *)0x0;
      pnVar2->counts[lVar11 + 1] = 0;
      pnVar2->elems[lVar11] = (void *)0x0;
      if (pnVar15 != (node234 *)0x0) {
        iVar17 = pnVar15->counts[3] + pnVar15->counts[1] + pnVar15->counts[2] + pnVar15->counts[0];
        lVar11 = 0;
        do {
          iVar17 = (iVar17 + 1) - (uint)(pnVar15->elems[lVar11] == (void *)0x0);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
      ptr->counts[lVar9] = iVar17;
      iVar17 = pnVar2->counts[3] + pnVar2->counts[1] + pnVar2->counts[2] + pnVar2->counts[0];
      lVar9 = 0;
      do {
        iVar17 = (iVar17 + 1) - (uint)(pnVar2->elems[lVar9] == (void *)0x0);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      ptr->counts[iVar18 + 1U] = iVar17;
    }
  }
  goto joined_r0x00164104;
}

Assistant:

static void *delpos234_internal(tree234 * t, int index)
{
    node234 *n;
    void *retval;
    int ei = -1;

    retval = 0;

    n = t->root;
    LOG(("deleting item %d from tree %p\n", index, t));
    while (1) {
        while (n) {
            int ki;
            node234 *sub;

            LOG(
                ("  node %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d index=%d\n",
                 n, n->kids[0], n->counts[0], n->elems[0], n->kids[1],
                 n->counts[1], n->elems[1], n->kids[2], n->counts[2],
                 n->elems[2], n->kids[3], n->counts[3], index));
            if (index < n->counts[0]) {
                ki = 0;
            } else if (index -= n->counts[0] + 1, index < 0) {
                ei = 0;
                break;
            } else if (index < n->counts[1]) {
                ki = 1;
            } else if (index -= n->counts[1] + 1, index < 0) {
                ei = 1;
                break;
            } else if (index < n->counts[2]) {
                ki = 2;
            } else if (index -= n->counts[2] + 1, index < 0) {
                ei = 2;
                break;
            } else {
                ki = 3;
            }
            /*
             * Recurse down to subtree ki. If it has only one element,
             * we have to do some transformation to start with.
             */
            LOG(("  moving to subtree %d\n", ki));
            sub = n->kids[ki];
            if (!sub->elems[1]) {
                LOG(("  subtree has only one element!\n"));
                if (ki > 0 && n->kids[ki - 1]->elems[1]) {
                    /*
                     * Case 3a, left-handed variant. Child ki has
                     * only one element, but child ki-1 has two or
                     * more. So we need to move a subtree from ki-1
                     * to ki.
                     *
                     *                . C .                     . B .
                     *               /     \     ->            /     \
                     * [more] a A b B c   d D e      [more] a A b   c C d D e
                     */
                    node234 *sib = n->kids[ki - 1];
                    int lastelem = (sib->elems[2] ? 2 :
                                    sib->elems[1] ? 1 : 0);
                    sub->kids[2] = sub->kids[1];
                    sub->counts[2] = sub->counts[1];
                    sub->elems[1] = sub->elems[0];
                    sub->kids[1] = sub->kids[0];
                    sub->counts[1] = sub->counts[0];
                    sub->elems[0] = n->elems[ki - 1];
                    sub->kids[0] = sib->kids[lastelem + 1];
                    sub->counts[0] = sib->counts[lastelem + 1];
                    if (sub->kids[0])
                        sub->kids[0]->parent = sub;
                    n->elems[ki - 1] = sib->elems[lastelem];
                    sib->kids[lastelem + 1] = NULL;
                    sib->counts[lastelem + 1] = 0;
                    sib->elems[lastelem] = NULL;
                    n->counts[ki] = countnode234(sub);
                    LOG(("  case 3a left\n"));
                    LOG(
                        ("  index and left subtree count before adjustment: %d, %d\n",
                         index, n->counts[ki - 1]));
                    index += n->counts[ki - 1];
                    n->counts[ki - 1] = countnode234(sib);
                    index -= n->counts[ki - 1];
                    LOG(
                        ("  index and left subtree count after adjustment: %d, %d\n",
                         index, n->counts[ki - 1]));
                } else if (ki < 3 && n->kids[ki + 1]
                           && n->kids[ki + 1]->elems[1]) {
                    /*
                     * Case 3a, right-handed variant. ki has only
                     * one element but ki+1 has two or more. Move a
                     * subtree from ki+1 to ki.
                     *
                     *      . B .                             . C .
                     *     /     \                ->         /     \
                     *  a A b   c C d D e [more]      a A b B c   d D e [more]
                     */
                    node234 *sib = n->kids[ki + 1];
                    int j;
                    sub->elems[1] = n->elems[ki];
                    sub->kids[2] = sib->kids[0];
                    sub->counts[2] = sib->counts[0];
                    if (sub->kids[2])
                        sub->kids[2]->parent = sub;
                    n->elems[ki] = sib->elems[0];
                    sib->kids[0] = sib->kids[1];
                    sib->counts[0] = sib->counts[1];
                    for (j = 0; j < 2 && sib->elems[j + 1]; j++) {
                        sib->kids[j + 1] = sib->kids[j + 2];
                        sib->counts[j + 1] = sib->counts[j + 2];
                        sib->elems[j] = sib->elems[j + 1];
                    }
                    sib->kids[j + 1] = NULL;
                    sib->counts[j + 1] = 0;
                    sib->elems[j] = NULL;
                    n->counts[ki] = countnode234(sub);
                    n->counts[ki + 1] = countnode234(sib);
                    LOG(("  case 3a right\n"));
                } else {
                    /*
                     * Case 3b. ki has only one element, and has no
                     * neighbour with more than one. So pick a
                     * neighbour and merge it with ki, taking an
                     * element down from n to go in the middle.
                     *
                     *      . B .                .
                     *     /     \     ->        |
                     *  a A b   c C d      a A b B c C d
                     *
                     * (Since at all points we have avoided
                     * descending to a node with only one element,
                     * we can be sure that n is not reduced to
                     * nothingness by this move, _unless_ it was
                     * the very first node, ie the root of the
                     * tree. In that case we remove the now-empty
                     * root and replace it with its single large
                     * child as shown.)
                     */
                    node234 *sib;
                    int j;

                    if (ki > 0) {
                        ki--;
                        index += n->counts[ki] + 1;
                    }
                    sib = n->kids[ki];
                    sub = n->kids[ki + 1];

                    sub->kids[3] = sub->kids[1];
                    sub->counts[3] = sub->counts[1];
                    sub->elems[2] = sub->elems[0];
                    sub->kids[2] = sub->kids[0];
                    sub->counts[2] = sub->counts[0];
                    sub->elems[1] = n->elems[ki];
                    sub->kids[1] = sib->kids[1];
                    sub->counts[1] = sib->counts[1];
                    if (sub->kids[1])
                        sub->kids[1]->parent = sub;
                    sub->elems[0] = sib->elems[0];
                    sub->kids[0] = sib->kids[0];
                    sub->counts[0] = sib->counts[0];
                    if (sub->kids[0])
                        sub->kids[0]->parent = sub;

                    n->counts[ki + 1] = countnode234(sub);

                    sfree(sib);

                    /*
                     * That's built the big node in sub. Now we
                     * need to remove the reference to sib in n.
                     */
                    for (j = ki; j < 3 && n->kids[j + 1]; j++) {
                        n->kids[j] = n->kids[j + 1];
                        n->counts[j] = n->counts[j + 1];
                        n->elems[j] = j < 2 ? n->elems[j + 1] : NULL;
                    }
                    n->kids[j] = NULL;
                    n->counts[j] = 0;
                    if (j < 3)
                        n->elems[j] = NULL;
                    LOG(("  case 3b ki=%d\n", ki));

                    if (!n->elems[0]) {
                        /*
                         * The root is empty and needs to be
                         * removed.
                         */
                        LOG(("  shifting root!\n"));
                        t->root = sub;
                        sub->parent = NULL;
                        sfree(n);
                    }
                }
            }
            n = sub;
        }
        if (!retval)
            retval = n->elems[ei];

        if (ei == -1)
            return NULL;               /* although this shouldn't happen */

        /*
         * Treat special case: this is the one remaining item in
         * the tree. n is the tree root (no parent), has one
         * element (no elems[1]), and has no kids (no kids[0]).
         */
        if (!n->parent && !n->elems[1] && !n->kids[0]) {
            LOG(("  removed last element in tree\n"));
            sfree(n);
            t->root = NULL;
            return retval;
        }

        /*
         * Now we have the element we want, as n->elems[ei], and we
         * have also arranged for that element not to be the only
         * one in its node. So...
         */

        if (!n->kids[0] && n->elems[1]) {
            /*
             * Case 1. n is a leaf node with more than one element,
             * so it's _really easy_. Just delete the thing and
             * we're done.
             */
            int i;
            LOG(("  case 1\n"));
            for (i = ei; i < 2 && n->elems[i + 1]; i++)
                n->elems[i] = n->elems[i + 1];
            n->elems[i] = NULL;
            /*
             * Having done that to the leaf node, we now go back up
             * the tree fixing the counts.
             */
            while (n->parent) {
                int childnum;
                childnum = (n->parent->kids[0] == n ? 0 :
                            n->parent->kids[1] == n ? 1 :
                            n->parent->kids[2] == n ? 2 : 3);
                n->parent->counts[childnum]--;
                n = n->parent;
            }
            return retval;             /* finished! */
        } else if (n->kids[ei]->elems[1]) {
            /*
             * Case 2a. n is an internal node, and the root of the
             * subtree to the left of e has more than one element.
             * So find the predecessor p to e (ie the largest node
             * in that subtree), place it where e currently is, and
             * then start the deletion process over again on the
             * subtree with p as target.
             */
            node234 *m = n->kids[ei];
            void *target;
            LOG(("  case 2a\n"));
            while (m->kids[0]) {
                m = (m->kids[3] ? m->kids[3] :
                     m->kids[2] ? m->kids[2] :
                     m->kids[1] ? m->kids[1] : m->kids[0]);
            }
            target = (m->elems[2] ? m->elems[2] :
                      m->elems[1] ? m->elems[1] : m->elems[0]);
            n->elems[ei] = target;
            index = n->counts[ei] - 1;
            n = n->kids[ei];
        } else if (n->kids[ei + 1]->elems[1]) {
            /*
             * Case 2b, symmetric to 2a but s/left/right/ and
             * s/predecessor/successor/. (And s/largest/smallest/).
             */
            node234 *m = n->kids[ei + 1];
            void *target;
            LOG(("  case 2b\n"));
            while (m->kids[0]) {
                m = m->kids[0];
            }
            target = m->elems[0];
            n->elems[ei] = target;
            n = n->kids[ei + 1];
            index = 0;
        } else {
            /*
             * Case 2c. n is an internal node, and the subtrees to
             * the left and right of e both have only one element.
             * So combine the two subnodes into a single big node
             * with their own elements on the left and right and e
             * in the middle, then restart the deletion process on
             * that subtree, with e still as target.
             */
            node234 *a = n->kids[ei], *b = n->kids[ei + 1];
            int j;

            LOG(("  case 2c\n"));
            a->elems[1] = n->elems[ei];
            a->kids[2] = b->kids[0];
            a->counts[2] = b->counts[0];
            if (a->kids[2])
                a->kids[2]->parent = a;
            a->elems[2] = b->elems[0];
            a->kids[3] = b->kids[1];
            a->counts[3] = b->counts[1];
            if (a->kids[3])
                a->kids[3]->parent = a;
            sfree(b);
            n->counts[ei] = countnode234(a);
            /*
             * That's built the big node in a, and destroyed b. Now
             * remove the reference to b (and e) in n.
             */
            for (j = ei; j < 2 && n->elems[j + 1]; j++) {
                n->elems[j] = n->elems[j + 1];
                n->kids[j + 1] = n->kids[j + 2];
                n->counts[j + 1] = n->counts[j + 2];
            }
            n->elems[j] = NULL;
            n->kids[j + 1] = NULL;
            n->counts[j + 1] = 0;
            /*
             * It's possible, in this case, that we've just removed
             * the only element in the root of the tree. If so,
             * shift the root.
             */
            if (n->elems[0] == NULL) {
                LOG(("  shifting root!\n"));
                t->root = a;
                a->parent = NULL;
                sfree(n);
            }
            /*
             * Now go round the deletion process again, with n
             * pointing at the new big node and e still the same.
             */
            n = a;
            index = a->counts[0] + a->counts[1] + 1;
        }
    }
}